

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O0

void __thiscall Movegen::generate<(Movetype)10,(Piece)3>(Movegen *this)

{
  U64 UVar1;
  int local_24;
  ulong local_20;
  U64 mvs;
  Square *s;
  Movegen *this_local;
  
  s = (Square *)this;
  for (mvs = (U64)this->rooks; *(int *)mvs != 0x41; mvs = mvs + 4) {
    UVar1 = magics::attacks<(Piece)3>(&this->all_pieces,(Square *)mvs);
    local_20 = UVar1 & this->qtarget;
    if (local_20 != 0) {
      local_24 = *(int *)mvs;
      encode<(Movetype)10>(this,&local_20,&local_24);
    }
  }
  return;
}

Assistant:

inline void Movegen::generate<quiet, rook>() {
	for (Square* s = &rooks[0]; *s != no_square; ++s) {
		U64 mvs = magics::attacks<rook>(all_pieces, *s) & qtarget;
		if (mvs != 0ULL) encode<quiet>(mvs, *s);
	}
}